

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

size_t __thiscall kws::Parser::FindEndOfClass(Parser *this,size_t position)

{
  ulong uVar1;
  string *psVar2;
  byte bVar3;
  size_t sVar4;
  size_t pos;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  size_t local_48;
  
  uVar9 = 0;
  if (position != 0xffffffffffffffff) {
    uVar9 = position;
  }
  psVar2 = &this->m_BufferNoComment;
  pos = std::__cxx11::string::find((char *)psVar2,0x16f702,uVar9);
  do {
    if (pos == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    uVar1 = pos + 1;
    uVar6 = (this->m_BufferNoComment)._M_string_length;
    if (uVar1 < uVar6) {
      uVar8 = uVar1;
      do {
        bVar3 = (psVar2->_M_dataplus)._M_p[uVar8];
        if (bVar3 < 0x20) {
          if ((bVar3 != 10) && (bVar3 != 0xd)) goto LAB_00123ac8;
        }
        else if (bVar3 != 0x20) {
          if (bVar3 != 0x3b) goto LAB_00123ac8;
          break;
        }
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
    }
    sVar5 = FindOpeningChar(this,'}','{',pos,true);
    uVar6 = std::__cxx11::string::find((char *)psVar2,0x178926,0);
    bVar10 = uVar6 < uVar9;
    sVar4 = local_48;
    if (bVar10) {
      do {
        sVar7 = uVar6;
        if (sVar5 != 0xffffffffffffffff) {
          if (uVar6 <= sVar5) {
            uVar8 = uVar6;
            do {
              sVar7 = uVar8;
              if ((psVar2->_M_dataplus)._M_p[uVar8] == '{') break;
              uVar8 = uVar8 + 1;
              sVar7 = uVar6;
            } while (sVar5 + 1 != uVar8);
          }
          sVar4 = pos;
          if (sVar5 == sVar7) break;
        }
        uVar6 = std::__cxx11::string::find((char *)psVar2,0x178926,sVar7 + 1);
        bVar10 = uVar6 < uVar9;
        sVar4 = local_48;
      } while (bVar10);
    }
    local_48 = sVar4;
    if (bVar10) {
      bVar10 = false;
    }
    else {
LAB_00123ac8:
      pos = std::__cxx11::string::find((char *)psVar2,0x16f702,uVar1);
      bVar10 = true;
    }
    if (!bVar10) {
      return local_48;
    }
  } while( true );
}

Assistant:

size_t Parser::FindEndOfClass(size_t position) const
{
  if(position == std::string::npos)
    {
    position = 0;
    }

  // Try to find the end of the class
  size_t endclass = m_BufferNoComment.find("}",position);
  while(endclass != std::string::npos)
    {
    bool isClass = true;
    // if the next char is not a semicolon this cannot be a class
    for(size_t i=endclass+1;i<m_BufferNoComment.size();i++)
      {
      if( (m_BufferNoComment[i] != ' ') && (m_BufferNoComment[i] != '\r')
        && (m_BufferNoComment[i] != '\n') && (m_BufferNoComment[i] != ';')
        )
        {
        isClass = false;
        break;
        }
      if(m_BufferNoComment[i] == ';')
        {
        break;
        }
      }

    if(isClass)
      {
      size_t openingChar = this->FindOpeningChar('}','{',endclass,true);
      // check if we have the class name somewhere
      size_t classPos = m_BufferNoComment.find("class",0);
      while(classPos != std::string::npos && classPos<position)
        {
        if(classPos != std::string::npos && openingChar!= std::string::npos)
          {
          for(size_t i=classPos;i<openingChar+1;i++)
            {
            if(m_BufferNoComment[i] == '{')
              {
              classPos = i;
              break;
              }
            }
          if(openingChar == classPos)
            {
            return endclass;
            }
          }
        classPos = m_BufferNoComment.find("class",classPos+1);
        }
      }
    endclass = m_BufferNoComment.find("}",endclass+1);
    }
  return std::string::npos;
}